

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::buildMetrics(NavierStokesBase *this)

{
  Geometry *this_00;
  Real *x;
  Real *x_00;
  DistributionMapping *dm;
  BoxArray *pBVar1;
  ostream *os_;
  Print *pPVar2;
  EBFArrayBoxFactory *this_01;
  MultiFab *pMVar3;
  int dir;
  long lVar4;
  FabArray<amrex::FArrayBox> *this_02;
  FabFactory<amrex::FArrayBox> local_1c8;
  Real *local_1c0;
  undefined1 local_1b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_1a8 [15];
  
  pMVar3 = &this->volume;
  amrex::FabArray<amrex::FArrayBox>::clear(&pMVar3->super_FabArray<amrex::FArrayBox>);
  dm = &(this->super_AmrLevel).dmap;
  local_1b8._0_8_ = (MultiCutFab *)0x1;
  local_1b8._8_8_ = (MultiCutFab *)0x0;
  avStack_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
  amrex::MultiFab::define
            (pMVar3,&(this->super_AmrLevel).grids,dm,1,1,(MFInfo *)local_1b8,&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1a8);
  this_00 = &(this->super_AmrLevel).geom;
  amrex::Geometry::GetVolume(this_00,pMVar3);
  this_02 = (FabArray<amrex::FArrayBox> *)&this->field_0x540;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    amrex::FabArray<amrex::FArrayBox>::clear(this_02);
    pBVar1 = amrex::AmrLevel::getEdgeBoxArray(&this->super_AmrLevel,(int)lVar4);
    local_1b8._0_8_ = (MultiCutFab *)0x1;
    avStack_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._8_8_ = (MultiCutFab *)0x0;
    avStack_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    (*(this_02->super_FabArrayBase)._vptr_FabArrayBase[2])
              (this_02,pBVar1,dm,1,1,local_1b8,&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1a8);
    amrex::Geometry::GetFaceArea(this_00,(MultiFab *)this_02,(int)lVar4);
    this_02 = this_02 + 1;
  }
  x = (this->super_AmrLevel).geom.super_CoordSys.dx;
  x_00 = (this->super_AmrLevel).geom.super_CoordSys.dx + 1;
  local_1c0 = (this->super_AmrLevel).geom.super_CoordSys.dx + 2;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    if (*x * 1e-12 < ABS(x_00[lVar4] - (this->super_AmrLevel).geom.super_CoordSys.dx[lVar4])) {
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)local_1b8,os_);
      std::operator<<((ostream *)avStack_1a8,"dx = ");
      pPVar2 = amrex::Print::operator<<((Print *)local_1b8,x);
      std::operator<<((ostream *)&pPVar2->ss," ");
      pPVar2 = amrex::Print::operator<<(pPVar2,x_00);
      std::operator<<((ostream *)&pPVar2->ss," ");
      pPVar2 = amrex::Print::operator<<(pPVar2,local_1c0);
      std::endl<char,std::char_traits<char>>((ostream *)&pPVar2->ss);
      amrex::Print::~Print((Print *)local_1b8);
      amrex::Abort_host("EB requires dx == dy (== dz)\n");
    }
  }
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_01 != (EBFArrayBoxFactory *)0x0) {
    pMVar3 = amrex::EBFArrayBoxFactory::getVolFrac(this_01);
    this->volfrac = pMVar3;
    amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)local_1b8,this_01);
    (this->areafrac)._M_elems[2] =
         (MultiCutFab *)
         avStack_1a8[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->areafrac)._M_elems[0] = (MultiCutFab *)local_1b8._0_8_;
    (this->areafrac)._M_elems[1] = (MultiCutFab *)local_1b8._8_8_;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::buildMetrics ()
{
    //
    // We "should" only need radius when we're RZ, but some 2-D code is written to
    // access it first and then "use" if if RZ.  It's easier to just always build
    // it for 2D than try to fix the underlying Fortran calls that take radius.
    //
#if (AMREX_SPACEDIM == 2)
    radius.resize(grids.size());

    const Real dxr = geom.CellSize()[0];

    for (int i = 0; i < grids.size(); i++)
    {
        const int ilo = grids[i].smallEnd(0)-radius_grow;
        const int ihi = grids[i].bigEnd(0)+radius_grow;
        const int len = ihi - ilo + 1;

        radius[i].resize(len);

        RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());

        const Real xlo = gridloc.lo(0) + (0.5 - radius_grow)*dxr;
        for (int j = 0; j < len; j++) {
            radius[i][j] = xlo + j*dxr;
        }
    }
#endif

    // volume and area are intentionally without EB knowledge
    volume.clear();
    volume.define(grids,dmap,1,GEOM_GROW);
    geom.GetVolume(volume);

    for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
    {
        area[dir].clear();
        area[dir].define(getEdgeBoxArray(dir),dmap,1,GEOM_GROW);
        geom.GetFaceArea(area[dir],dir);
    }

#ifdef AMREX_USE_EB
    // make sure dx == dy == dz
    const Real* dx = geom.CellSize();
    for (int i = 1; i < AMREX_SPACEDIM; i++){
        if (std::abs(dx[i]-dx[i-1]) > 1.e-12*dx[0]){
            Print()<<"dx = "
                   <<AMREX_D_TERM(dx[0], <<" "<<dx[1], <<" "<<dx[2])
                   <<std::endl;
            amrex::Abort("EB requires dx == dy (== dz)\n");
        }
    }

    const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
    volfrac = &(ebfactory.getVolFrac());
    areafrac = ebfactory.getAreaFrac();

#endif
}